

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Probe.cpp
# Opt level: O1

void __thiscall helics::apps::Probe::Probe(Probe *this,string_view name,string *configString)

{
  apps::App::App(&this->super_App,(string_view)name,(string *)configString);
  (this->super_App)._vptr_App = (_func_int **)&PTR__Probe_005598c8;
  (this->endpoint).super_Interface.mCore = (Core *)0x0;
  (this->endpoint).super_Interface.handle.hid = -1700000000;
  (this->endpoint).super_Interface.mName._M_dataplus._M_p =
       (pointer)&(this->endpoint).super_Interface.mName.field_2;
  (this->endpoint).super_Interface.mName._M_string_length = 0;
  (this->endpoint).super_Interface.mName.field_2._M_local_buf[0] = '\0';
  (this->endpoint).super_Interface._vptr_Interface = (_func_int **)&PTR__Endpoint_00551e88;
  (this->endpoint).fed = (MessageFederate *)0x0;
  (this->endpoint).referenceIndex = -1;
  (this->endpoint).dataReference = (void *)0x0;
  (this->endpoint).disableAssign = false;
  (this->endpoint).receiveOnly = false;
  (this->endpoint).defDest._M_dataplus._M_p = (pointer)&(this->endpoint).defDest.field_2;
  (this->endpoint).defDest._M_string_length = 0;
  (this->endpoint).defDest.field_2._M_local_buf[0] = '\0';
  this->connections = 0;
  this->messagesReceived = 0;
  return;
}

Assistant:

Probe::Probe(std::string_view name, const std::string& configString): App(name, configString) {}